

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int wherePathSolver(WhereInfo *pWInfo,LogEst nRowEst)

{
  undefined8 *puVar1;
  byte bVar2;
  char cVar3;
  undefined2 uVar4;
  Parse *pParse;
  SrcList *pSVar5;
  WhereLoop **ppWVar6;
  ExprList *pOrderBy;
  bool bVar7;
  byte bVar8;
  i8 iVar9;
  LogEst LVar10;
  LogEst LVar11;
  ushort uVar12;
  short sVar13;
  int iVar14;
  int extraout_EAX;
  ulong uVar15;
  WherePath *p;
  long lVar16;
  short sVar17;
  ulong uVar18;
  WhereLoop ***pppWVar19;
  LogEst *pLVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  WherePath *pWVar24;
  WherePath *pPath;
  short sVar25;
  uint uVar28;
  WhereLoop *pWVar26;
  WhereLoop **ppWVar27;
  ulong uVar29;
  short sVar30;
  ulong uVar31;
  int iVar32;
  uint uVar33;
  WhereLoop *pWVar34;
  uint uVar35;
  WherePath *pWVar36;
  short sVar37;
  int iVar38;
  long in_FS_OFFSET;
  bool bVar39;
  Bitmask revMask;
  ulong local_b0;
  int local_a4;
  WhereLoop **local_a0;
  WherePath *local_90;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pParse = pWInfo->pParse;
  bVar2 = pWInfo->nLevel;
  uVar15 = (ulong)bVar2;
  uVar35 = 1;
  if (((1 < bVar2) && (uVar35 = 5, bVar2 != 2)) && (uVar35 = 1, pParse->nErr == 0)) {
    if (((4 < bVar2) && ((pWInfo->field_0x44 & 0x10) == 0)) &&
       ((pParse->db->dbOptFlags & 0x20000000) == 0)) {
      pWInfo->field_0x44 = pWInfo->field_0x44 | 0x10;
      pSVar5 = pWInfo->pTabList;
      pWVar26 = pWInfo->pLoops;
      uVar18 = 1;
      uVar23 = 0;
      uVar29 = 0;
      do {
        if ((pSVar5->a[uVar23].fg.jointype & 0x22) == 0) {
LAB_00193f12:
          if (pWVar26 == (WhereLoop *)0x0) {
            bVar7 = true;
            uVar31 = 0;
          }
          else {
            uVar31 = 0;
            iVar32 = 0;
            pWVar34 = pWVar26;
            do {
              if ((pSVar5->a[pWVar34->iTab].fg.jointype & 0x22) != 0) break;
              if (((pWVar34->prereq & uVar18) != 0) &&
                 ((pWVar34->maskSelf & (uVar31 | uVar29)) == 0)) {
                if (pSVar5->a[pWVar34->iTab].pSTab == pSVar5->a[uVar23].pSTab) {
                  uVar29 = uVar29 | uVar18;
                }
                else {
                  iVar32 = iVar32 + 1;
                  uVar31 = uVar31 | pWVar34->maskSelf;
                }
              }
              pWVar34 = pWVar34->pNextLoop;
            } while (pWVar34 != (WhereLoop *)0x0);
            bVar7 = iVar32 < 4;
          }
          if (!bVar7) {
            pWInfo->field_0x44 = pWInfo->field_0x44 | 0x20;
            uVar35 = 0x8000;
            for (pWVar34 = pWVar26; sVar17 = (short)uVar35, pWVar34 != (WhereLoop *)0x0;
                pWVar34 = pWVar34->pNextLoop) {
              uVar28 = uVar35;
              if (uVar23 <= pWVar34->iTab) {
                if (uVar23 < pWVar34->iTab) break;
                uVar28._0_2_ = pWVar34->rRun;
                uVar28._2_2_ = pWVar34->nOut;
                if ((short)(undefined2)uVar28 <= sVar17) {
                  uVar28 = uVar35;
                }
              }
              uVar35 = uVar28;
            }
            pWVar34 = pWVar26;
            sVar30 = sVar17 + 1;
            if ((uVar35 & 0xffff) == 0x7fff) {
              sVar30 = sVar17;
            }
            for (; pWVar34 != (WhereLoop *)0x0; pWVar34 = pWVar34->pNextLoop) {
              if ((((pWVar34->maskSelf & uVar31) != 0) && (pWVar34->nLTerm == 0)) &&
                 (pWVar34->rRun < sVar30)) {
                pWVar34->rRun = sVar30;
              }
            }
          }
          bVar7 = false;
        }
        else {
          bVar7 = true;
          if (uVar23 + 4 <= uVar15) {
            for (; pWVar26 != (WhereLoop *)0x0; pWVar26 = pWVar26->pNextLoop) {
              if ((byte)uVar23 < pWVar26->iTab) goto LAB_00193f12;
            }
            pWVar26 = (WhereLoop *)0x0;
            goto LAB_00193f12;
          }
        }
        if (bVar7) break;
        uVar23 = uVar23 + 1;
        uVar18 = uVar18 * 2;
      } while (uVar23 != uVar15);
    }
    uVar35 = 0x12;
    if ((pWInfo->field_0x44 & 0x20) == 0) {
      uVar35 = 0xc;
    }
  }
  iVar32 = 0;
  if (nRowEst != 0 && pWInfo->pOrderBy != (ExprList *)0x0) {
    iVar32 = pWInfo->pOrderBy->nExpr;
  }
  p = (WherePath *)
      sqlite3DbMallocRawNN
                (pParse->db,
                 (long)(int)(((uint)bVar2 * 0x10 + 0x40) * uVar35 + (int)((long)iVar32 * 2)));
  if (p == (WherePath *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return (int)*(long *)(in_FS_OFFSET + 0x28);
    }
  }
  else {
    uVar18 = (ulong)(uVar35 << 5);
    pPath = (WherePath *)((long)&p->maskLoop + uVar18);
    puVar1 = (undefined8 *)((long)&p->nRow + uVar18);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&p->maskLoop + uVar18);
    *puVar1 = 0;
    puVar1[1] = 0;
    local_a0 = (WhereLoop **)((long)&pPath->maskLoop + uVar18);
    pppWVar19 = &p->aLoop;
    iVar21 = uVar35 * 2 + 1;
    do {
      *pppWVar19 = local_a0;
      local_a0 = (WhereLoop **)((long)local_a0 + (ulong)((uint)bVar2 * 8));
      pppWVar19 = pppWVar19 + 4;
      iVar21 = iVar21 + -1;
    } while (1 < iVar21);
    if (iVar32 == 0) {
      local_a0 = (WhereLoop **)0x0;
    }
    else {
      memset(local_a0,0,(long)iVar32 * 2);
    }
    uVar4 = pParse->nQueryLoop;
    sVar17 = 0x30;
    if ((short)uVar4 < 0x30) {
      sVar17 = uVar4;
    }
    pPath->nRow = sVar17;
    if (iVar32 != 0) {
      pPath->isOrdered = -(uVar15 != 0) | (byte)iVar32;
    }
    if (uVar15 == 0) {
      uVar18 = 1;
    }
    else {
      local_b0 = 0;
      iVar21 = 1;
      sVar17 = 0;
      sVar30 = 0;
      uVar28 = 0;
      pWVar36 = p;
      local_90 = pPath;
      do {
        pPath = pWVar36;
        if (iVar21 < 1) {
          uVar18 = 0;
        }
        else {
          uVar18 = 0;
          local_a4 = 0;
          pWVar36 = local_90;
          do {
            for (pWVar26 = pWInfo->pLoops; pWVar26 != (WhereLoop *)0x0; pWVar26 = pWVar26->pNextLoop
                ) {
              local_40 = &DAT_aaaaaaaaaaaaaaaa;
              uVar23 = pWVar36->maskLoop;
              if ((((pWVar26->prereq & ~uVar23) == 0) &&
                  (uVar29 = pWVar26->maskSelf, (uVar29 & uVar23) == 0)) &&
                 (((pWVar26->wsFlags & 0x4000) == 0 || (2 < pWVar36->nRow)))) {
                uVar33 = (uint)uVar18;
                sVar25 = pWVar36->nRow;
                LVar10 = pWVar26->rRun + sVar25;
                if (pWVar26->rSetup != 0) {
                  LVar10 = sqlite3LogEstAdd(pWVar26->rSetup,LVar10);
                }
                LVar10 = sqlite3LogEstAdd(LVar10,pWVar36->rUnsort);
                sVar25 = sVar25 + pWVar26->nOut;
                bVar8 = pWVar36->isOrdered;
                if ((char)bVar8 < '\0') {
                  local_40 = (undefined1 *)0x0;
                  bVar8 = wherePathSatisfiesOrderBy
                                    (pWInfo,pWInfo->pOrderBy,pWVar36,pWInfo->wctrlFlags,
                                     (u16)local_b0,pWVar26,(Bitmask *)&local_40);
                }
                else {
                  local_40 = (undefined1 *)pWVar36->revLoop;
                }
                iVar38 = iVar32 - (char)bVar8;
                if ((iVar38 == 0 || iVar32 < (char)bVar8) || (char)bVar8 < '\0') {
                  LVar11 = LVar10 + -2;
                  sVar37 = LVar10;
                }
                else {
                  uVar31 = (ulong)bVar8;
                  if (*(short *)((long)local_a0 + uVar31 * 2) == 0) {
                    iVar14 = pWInfo->pSelect->pEList->nExpr;
                    iVar14 = iVar14 + (int)((ulong)((long)(iVar14 + 0x3b) * -0x77777777) >> 0x20) +
                             0x3b;
                    LVar11 = sqlite3LogEst((long)((iVar14 >> 4) - (iVar14 >> 0x1f)));
                    sVar37 = LVar11 + nRowEst;
                    if ('\0' < (char)bVar8) {
                      LVar11 = sqlite3LogEst((long)((iVar38 * 100) / iVar32));
                      sVar37 = sVar37 + LVar11 + -0x42;
                    }
                    if ((pWInfo->wctrlFlags >> 0xe & 1) == 0) {
                      uVar12 = nRowEst;
                      if ((pWInfo->wctrlFlags & 0x100) != 0) {
                        uVar12 = nRowEst - 10;
                      }
                      if (nRowEst < 0xb) {
                        uVar12 = nRowEst;
                      }
                    }
                    else {
                      sVar13 = sVar37 + 0x10;
                      sVar37 = sVar37 + 10;
                      if (bVar8 != 0) {
                        sVar37 = sVar13;
                      }
                      uVar12 = pWInfo->iLimit;
                      if (nRowEst <= pWInfo->iLimit) {
                        uVar12 = nRowEst;
                      }
                    }
                    if ((short)uVar12 < 0xb) {
                      sVar13 = 0;
                    }
                    else {
                      LVar11 = sqlite3LogEst((ulong)uVar12);
                      sVar13 = LVar11 + -0x21;
                    }
                    *(short *)((long)local_a0 + uVar31 * 2) = sVar13 + sVar37;
                  }
                  LVar11 = sqlite3LogEstAdd(LVar10,*(LogEst *)((long)local_a0 + uVar31 * 2));
                  sVar37 = LVar11 + 3;
                  LVar11 = LVar10;
                }
                bVar7 = 0 < (int)uVar33;
                if (0 < (int)uVar33) {
                  pWVar24 = pPath;
                  uVar22 = 1;
                  do {
                    if ((pWVar24->maskLoop == (uVar29 | uVar23)) &&
                       (-1 < (char)(pWVar24->isOrdered ^ bVar8))) {
                      if (bVar7) {
                        sVar13 = pWVar24->rCost;
                        if ((sVar13 < sVar37) ||
                           ((sVar13 == sVar37 &&
                            ((pWVar24->nRow < sVar25 ||
                             ((sVar13 == sVar37 &&
                              (((pWVar24->nRow == sVar25 && (pWVar24->rUnsort < LVar11)) ||
                               ((sVar13 == sVar37 &&
                                (((pWVar24->nRow == sVar25 && (pWVar24->rUnsort == LVar11)) &&
                                 (iVar38 = whereLoopIsNoBetter(pWVar26,pWVar24->aLoop[local_b0]),
                                 iVar38 != 0)))))))))))))) goto LAB_0019463f;
                        goto LAB_00194557;
                      }
                      break;
                    }
                    pWVar24 = pWVar24 + 1;
                    bVar7 = (int)uVar22 < (int)uVar33;
                    bVar39 = uVar22 != uVar33;
                    uVar22 = uVar22 + 1;
                  } while (bVar39);
                }
                uVar22 = uVar33;
                if (((int)uVar33 < (int)uVar35) ||
                   ((sVar37 <= sVar30 && ((uVar22 = uVar28, sVar37 != sVar30 || (LVar11 < sVar17))))
                   )) {
                  uVar33 = uVar33 + ((int)uVar33 < (int)uVar35);
                  pWVar24 = pPath + (int)uVar22;
LAB_00194557:
                  pWVar24->maskLoop = pWVar26->maskSelf | pWVar36->maskLoop;
                  pWVar24->revLoop = (Bitmask)local_40;
                  pWVar24->nRow = sVar25;
                  pWVar24->rCost = sVar37;
                  pWVar24->rUnsort = LVar11;
                  pWVar24->isOrdered = bVar8;
                  memcpy(pWVar24->aLoop,pWVar36->aLoop,local_b0 * 8);
                  pWVar24->aLoop[local_b0] = pWVar26;
                  uVar18 = (ulong)uVar33;
                  if ((int)uVar35 <= (int)uVar33) {
                    uVar28 = 0;
                    sVar17 = pPath->nRow;
                    sVar30 = pPath->rCost;
                    if (1 < uVar35) {
                      uVar33 = 1;
                      uVar28 = 0;
                      pLVar20 = &pPath[1].rUnsort;
                      do {
                        sVar25 = pLVar20[-1];
                        if ((sVar30 < sVar25) || ((sVar25 == sVar30 && (sVar17 < *pLVar20)))) {
                          sVar17 = *pLVar20;
                          uVar28 = uVar33;
                          sVar30 = sVar25;
                        }
                        uVar33 = uVar33 + 1;
                        pLVar20 = pLVar20 + 0x10;
                      } while (uVar35 != uVar33);
                    }
                  }
                }
              }
LAB_0019463f:
            }
            local_a4 = local_a4 + 1;
            pWVar36 = pWVar36 + 1;
          } while (local_a4 != iVar21);
        }
        local_b0 = local_b0 + 1;
        iVar21 = (int)uVar18;
        pWVar36 = local_90;
        local_90 = pPath;
      } while (local_b0 != uVar15);
    }
    if ((int)uVar18 == 0) {
      sqlite3ErrorMsg(pParse,"no query solution");
    }
    else {
      if (1 < (int)uVar18) {
        lVar16 = uVar18 - 1;
        pWVar24 = pPath;
        pWVar36 = pPath;
        do {
          pPath = pWVar36 + 1;
          if (pWVar24->rCost <= pWVar36[1].rCost) {
            pPath = pWVar24;
          }
          lVar16 = lVar16 + -1;
          pWVar24 = pPath;
          pWVar36 = pWVar36 + 1;
        } while (lVar16 != 0);
      }
      uVar35 = (uint)bVar2;
      if (uVar15 != 0) {
        ppWVar6 = pPath->aLoop;
        pSVar5 = pWInfo->pTabList;
        ppWVar27 = &pWInfo->a[0].pWLoop;
        uVar18 = 0;
        do {
          pWVar26 = ppWVar6[uVar18];
          *ppWVar27 = pWVar26;
          bVar8 = pWVar26->iTab;
          *(byte *)(ppWVar27 + -4) = bVar8;
          *(int *)((long)ppWVar27 + -0x5c) = pSVar5->a[bVar8].iCursor;
          uVar18 = uVar18 + 1;
          ppWVar27 = ppWVar27 + 0xe;
        } while (uVar15 != uVar18);
      }
      if ((((pWInfo->wctrlFlags & 0x180) == 0x100) && (nRowEst != 0)) && (pWInfo->eDistinct == '\0')
         ) {
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        iVar9 = wherePathSatisfiesOrderBy
                          (pWInfo,pWInfo->pResultSet,pPath,0x80,bVar2 - 1,pPath->aLoop[uVar15 - 1],
                           (Bitmask *)&local_40);
        if (pWInfo->pResultSet->nExpr == (int)iVar9) {
          pWInfo->eDistinct = '\x02';
        }
      }
      bVar2 = pWInfo->field_0x44;
      pWInfo->field_0x44 = bVar2 & 0xfb;
      pOrderBy = pWInfo->pOrderBy;
      if (pOrderBy != (ExprList *)0x0) {
        cVar3 = pPath->isOrdered;
        pWInfo->nOBSat = cVar3;
        if ((char)pWInfo->wctrlFlags < '\0') {
          if (pOrderBy->nExpr == (int)cVar3) {
            pWInfo->eDistinct = '\x02';
          }
        }
        else {
          pWInfo->revMask = pPath->revLoop;
          if (cVar3 < '\x01') {
            pWInfo->nOBSat = '\0';
            if (uVar15 != 0) {
              uVar28 = pPath->aLoop[uVar35 - 1]->wsFlags;
              if ((~uVar28 & 0x104) != 0 && (uVar28 >> 0xc & 1) == 0) {
                local_40 = (undefined1 *)0x0;
                iVar9 = wherePathSatisfiesOrderBy
                                  (pWInfo,pOrderBy,pPath,0x800,(u16)(uVar35 - 1),
                                   pPath->aLoop[uVar35 - 1],(Bitmask *)&local_40);
                if (pWInfo->pOrderBy->nExpr == (int)iVar9) {
                  pWInfo->field_0x44 = pWInfo->field_0x44 | 4;
                  pWInfo->revMask = (Bitmask)local_40;
                }
              }
            }
          }
          else if (((pWInfo->wctrlFlags & 3) != 0 && uVar35 != 0) && cVar3 == '\x01') {
            pWInfo->field_0x44 = bVar2 | 4;
          }
        }
        if ((((pWInfo->wctrlFlags & 0x200) != 0) && (uVar15 != 0)) &&
           (pWInfo->pOrderBy->nExpr == (int)pWInfo->nOBSat)) {
          local_40 = (undefined1 *)0x0;
          iVar9 = wherePathSatisfiesOrderBy
                            (pWInfo,pWInfo->pOrderBy,pPath,0,(u16)(uVar35 - 1),
                             pPath->aLoop[uVar35 - 1],(Bitmask *)&local_40);
          if (pWInfo->pOrderBy->nExpr == (int)iVar9) {
            pWInfo->field_0x44 = pWInfo->field_0x44 | 8;
            pWInfo->revMask = (Bitmask)local_40;
          }
        }
      }
      pWInfo->nRowOut = pPath->nRow;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      sqlite3DbFreeNN(pParse->db,p);
      return extraout_EAX;
    }
  }
  __stack_chk_fail();
}

Assistant:

static int wherePathSolver(WhereInfo *pWInfo, LogEst nRowEst){
  int mxChoice;             /* Maximum number of simultaneous paths tracked */
  int nLoop;                /* Number of terms in the join */
  Parse *pParse;            /* Parsing context */
  int iLoop;                /* Loop counter over the terms of the join */
  int ii, jj;               /* Loop counters */
  int mxI = 0;              /* Index of next entry to replace */
  int nOrderBy;             /* Number of ORDER BY clause terms */
  LogEst mxCost = 0;        /* Maximum cost of a set of paths */
  LogEst mxUnsort = 0;      /* Maximum unsorted cost of a set of path */
  int nTo, nFrom;           /* Number of valid entries in aTo[] and aFrom[] */
  WherePath *aFrom;         /* All nFrom paths at the previous level */
  WherePath *aTo;           /* The nTo best paths at the current level */
  WherePath *pFrom;         /* An element of aFrom[] that we are working on */
  WherePath *pTo;           /* An element of aTo[] that we are working on */
  WhereLoop *pWLoop;        /* One of the WhereLoop objects */
  WhereLoop **pX;           /* Used to divy up the pSpace memory */
  LogEst *aSortCost = 0;    /* Sorting and partial sorting costs */
  char *pSpace;             /* Temporary memory used by this routine */
  int nSpace;               /* Bytes of space allocated at pSpace */

  pParse = pWInfo->pParse;
  nLoop = pWInfo->nLevel;
  WHERETRACE(0x002, ("---- begin solver.  (nRowEst=%d, nQueryLoop=%d)\n",
                     nRowEst, pParse->nQueryLoop));
  /* TUNING: mxChoice is the maximum number of possible paths to preserve
  ** at each step.  Based on the number of loops in the FROM clause:
  **
  **     nLoop      mxChoice
  **     -----      --------
  **       1            1            // the most common case
  **       2            5
  **       3+        12 or 18        // see computeMxChoice()
  */
  if( nLoop<=1 ){
    mxChoice = 1;
  }else if( nLoop==2 ){
    mxChoice = 5;
  }else if( pParse->nErr ){
    mxChoice = 1;
  }else{
    mxChoice = computeMxChoice(pWInfo);
  }
  assert( nLoop<=pWInfo->pTabList->nSrc );

  /* If nRowEst is zero and there is an ORDER BY clause, ignore it. In this
  ** case the purpose of this call is to estimate the number of rows returned
  ** by the overall query. Once this estimate has been obtained, the caller
  ** will invoke this function a second time, passing the estimate as the
  ** nRowEst parameter.  */
  if( pWInfo->pOrderBy==0 || nRowEst==0 ){
    nOrderBy = 0;
  }else{
    nOrderBy = pWInfo->pOrderBy->nExpr;
  }

  /* Allocate and initialize space for aTo, aFrom and aSortCost[] */
  nSpace = (sizeof(WherePath)+sizeof(WhereLoop*)*nLoop)*mxChoice*2;
  nSpace += sizeof(LogEst) * nOrderBy;
  pSpace = sqlite3StackAllocRawNN(pParse->db, nSpace);
  if( pSpace==0 ) return SQLITE_NOMEM_BKPT;
  aTo = (WherePath*)pSpace;
  aFrom = aTo+mxChoice;
  memset(aFrom, 0, sizeof(aFrom[0]));
  pX = (WhereLoop**)(aFrom+mxChoice);
  for(ii=mxChoice*2, pFrom=aTo; ii>0; ii--, pFrom++, pX += nLoop){
    pFrom->aLoop = pX;
  }
  if( nOrderBy ){
    /* If there is an ORDER BY clause and it is not being ignored, set up
    ** space for the aSortCost[] array. Each element of the aSortCost array
    ** is either zero - meaning it has not yet been initialized - or the
    ** cost of sorting nRowEst rows of data where the first X terms of
    ** the ORDER BY clause are already in order, where X is the array
    ** index.  */
    aSortCost = (LogEst*)pX;
    memset(aSortCost, 0, sizeof(LogEst) * nOrderBy);
  }
  assert( aSortCost==0 || &pSpace[nSpace]==(char*)&aSortCost[nOrderBy] );
  assert( aSortCost!=0 || &pSpace[nSpace]==(char*)pX );

  /* Seed the search with a single WherePath containing zero WhereLoops.
  **
  ** TUNING: Do not let the number of iterations go above 28.  If the cost
  ** of computing an automatic index is not paid back within the first 28
  ** rows, then do not use the automatic index. */
  aFrom[0].nRow = MIN(pParse->nQueryLoop, 48);  assert( 48==sqlite3LogEst(28) );
  nFrom = 1;
  assert( aFrom[0].isOrdered==0 );
  if( nOrderBy ){
    /* If nLoop is zero, then there are no FROM terms in the query. Since
    ** in this case the query may return a maximum of one row, the results
    ** are already in the requested order. Set isOrdered to nOrderBy to
    ** indicate this. Or, if nLoop is greater than zero, set isOrdered to
    ** -1, indicating that the result set may or may not be ordered,
    ** depending on the loops added to the current plan.  */
    aFrom[0].isOrdered = nLoop>0 ? -1 : nOrderBy;
  }

  /* Compute successively longer WherePaths using the previous generation
  ** of WherePaths as the basis for the next.  Keep track of the mxChoice
  ** best paths at each generation */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    nTo = 0;
    for(ii=0, pFrom=aFrom; ii<nFrom; ii++, pFrom++){
      for(pWLoop=pWInfo->pLoops; pWLoop; pWLoop=pWLoop->pNextLoop){
        LogEst nOut;                      /* Rows visited by (pFrom+pWLoop) */
        LogEst rCost;                     /* Cost of path (pFrom+pWLoop) */
        LogEst rUnsort;                   /* Unsorted cost of (pFrom+pWLoop) */
        i8 isOrdered;                     /* isOrdered for (pFrom+pWLoop) */
        Bitmask maskNew;                  /* Mask of src visited by (..) */
        Bitmask revMask;                  /* Mask of rev-order loops for (..) */

        if( (pWLoop->prereq & ~pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->maskSelf & pFrom->maskLoop)!=0 ) continue;
        if( (pWLoop->wsFlags & WHERE_AUTO_INDEX)!=0 && pFrom->nRow<3 ){
          /* Do not use an automatic index if the this loop is expected
          ** to run less than 1.25 times.  It is tempting to also exclude
          ** automatic index usage on an outer loop, but sometimes an automatic
          ** index is useful in the outer loop of a correlated subquery. */
          assert( 10==sqlite3LogEst(2) );
          continue;
        }

        /* At this point, pWLoop is a candidate to be the next loop.
        ** Compute its cost */
        rUnsort = pWLoop->rRun + pFrom->nRow;
        if( pWLoop->rSetup ){
          rUnsort = sqlite3LogEstAdd(pWLoop->rSetup, rUnsort);
        }
        rUnsort = sqlite3LogEstAdd(rUnsort, pFrom->rUnsort);
        nOut = pFrom->nRow + pWLoop->nOut;
        maskNew = pFrom->maskLoop | pWLoop->maskSelf;
        isOrdered = pFrom->isOrdered;
        if( isOrdered<0 ){
          revMask = 0;
          isOrdered = wherePathSatisfiesOrderBy(pWInfo,
                       pWInfo->pOrderBy, pFrom, pWInfo->wctrlFlags,
                       iLoop, pWLoop, &revMask);
        }else{
          revMask = pFrom->revLoop;
        }
        if( isOrdered>=0 && isOrdered<nOrderBy ){
          if( aSortCost[isOrdered]==0 ){
            aSortCost[isOrdered] = whereSortingCost(
                pWInfo, nRowEst, nOrderBy, isOrdered
            );
          }
          /* TUNING:  Add a small extra penalty (3) to sorting as an
          ** extra encouragement to the query planner to select a plan
          ** where the rows emerge in the correct order without any sorting
          ** required. */
          rCost = sqlite3LogEstAdd(rUnsort, aSortCost[isOrdered]) + 3;

          WHERETRACE(0x002,
              ("---- sort cost=%-3d (%d/%d) increases cost %3d to %-3d\n",
               aSortCost[isOrdered], (nOrderBy-isOrdered), nOrderBy,
               rUnsort, rCost));
        }else{
          rCost = rUnsort;
          rUnsort -= 2;  /* TUNING:  Slight bias in favor of no-sort plans */
        }

        /* Check to see if pWLoop should be added to the set of
        ** mxChoice best-so-far paths.
        **
        ** First look for an existing path among best-so-far paths
        ** that covers the same set of loops and has the same isOrdered
        ** setting as the current path candidate.
        **
        ** The term "((pTo->isOrdered^isOrdered)&0x80)==0" is equivalent
        ** to (pTo->isOrdered==(-1))==(isOrdered==(-1))" for the range
        ** of legal values for isOrdered, -1..64.
        */
        testcase( nTo==0 );
        for(jj=0, pTo=aTo; jj<nTo; jj++, pTo++){
          if( pTo->maskLoop==maskNew
           && ((pTo->isOrdered^isOrdered)&0x80)==0
          ){
            testcase( jj==nTo-1 );
            break;
          }
        }
        if( jj>=nTo ){
          /* None of the existing best-so-far paths match the candidate. */
          if( nTo>=mxChoice
           && (rCost>mxCost || (rCost==mxCost && rUnsort>=mxUnsort))
          ){
            /* The current candidate is no better than any of the mxChoice
            ** paths currently in the best-so-far buffer.  So discard
            ** this candidate as not viable. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf("Skip   %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsort,
                  isOrdered>=0 ? isOrdered+'0' : '?');
            }
#endif
            continue;
          }
          /* If we reach this points it means that the new candidate path
          ** needs to be added to the set of best-so-far paths. */
          if( nTo<mxChoice ){
            /* Increase the size of the aTo set by one */
            jj = nTo++;
          }else{
            /* New path replaces the prior worst to keep count below mxChoice */
            jj = mxI;
          }
          pTo = &aTo[jj];
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf("New    %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsort,
                isOrdered>=0 ? isOrdered+'0' : '?');
          }
#endif
        }else{
          /* Control reaches here if best-so-far path pTo=aTo[jj] covers the
          ** same set of loops and has the same isOrdered setting as the
          ** candidate path.  Check to see if the candidate should replace
          ** pTo or if the candidate should be skipped.
          **
          ** The conditional is an expanded vector comparison equivalent to:
          **   (pTo->rCost,pTo->nRow,pTo->rUnsort) <= (rCost,nOut,rUnsort)
          */
          if( (pTo->rCost<rCost)
           || (pTo->rCost==rCost && pTo->nRow<nOut)
           || (pTo->rCost==rCost && pTo->nRow==nOut && pTo->rUnsort<rUnsort)
           || (pTo->rCost==rCost && pTo->nRow==nOut && pTo->rUnsort==rUnsort
                  && whereLoopIsNoBetter(pWLoop, pTo->aLoop[iLoop]) )
          ){
#ifdef WHERETRACE_ENABLED /* 0x4 */
            if( sqlite3WhereTrace&0x4 ){
              sqlite3DebugPrintf(
                  "Skip   %s cost=%-3d,%3d,%3d order=%c",
                  wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsort,
                  isOrdered>=0 ? isOrdered+'0' : '?');
              sqlite3DebugPrintf("   vs %s cost=%-3d,%3d,%3d order=%c\n",
                  wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                  pTo->rUnsort, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
            }
#endif
            /* Discard the candidate path from further consideration */
            testcase( pTo->rCost==rCost );
            continue;
          }
          testcase( pTo->rCost==rCost+1 );
          /* Control reaches here if the candidate path is better than the
          ** pTo path.  Replace pTo with the candidate. */
#ifdef WHERETRACE_ENABLED /* 0x4 */
          if( sqlite3WhereTrace&0x4 ){
            sqlite3DebugPrintf(
                "Update %s cost=%-3d,%3d,%3d order=%c",
                wherePathName(pFrom, iLoop, pWLoop), rCost, nOut, rUnsort,
                isOrdered>=0 ? isOrdered+'0' : '?');
            sqlite3DebugPrintf("  was %s cost=%-3d,%3d,%3d order=%c\n",
                wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
                pTo->rUnsort, pTo->isOrdered>=0 ? pTo->isOrdered+'0' : '?');
          }
#endif
        }
        /* pWLoop is a winner.  Add it to the set of best so far */
        pTo->maskLoop = pFrom->maskLoop | pWLoop->maskSelf;
        pTo->revLoop = revMask;
        pTo->nRow = nOut;
        pTo->rCost = rCost;
        pTo->rUnsort = rUnsort;
        pTo->isOrdered = isOrdered;
        memcpy(pTo->aLoop, pFrom->aLoop, sizeof(WhereLoop*)*iLoop);
        pTo->aLoop[iLoop] = pWLoop;
        if( nTo>=mxChoice ){
          mxI = 0;
          mxCost = aTo[0].rCost;
          mxUnsort = aTo[0].nRow;
          for(jj=1, pTo=&aTo[1]; jj<mxChoice; jj++, pTo++){
            if( pTo->rCost>mxCost
             || (pTo->rCost==mxCost && pTo->rUnsort>mxUnsort)
            ){
              mxCost = pTo->rCost;
              mxUnsort = pTo->rUnsort;
              mxI = jj;
            }
          }
        }
      }
    }

#ifdef WHERETRACE_ENABLED  /* >=2 */
    if( sqlite3WhereTrace & 0x02 ){
      LogEst rMin, rFloor = 0;
      int nDone = 0;
      int nProgress;
      sqlite3DebugPrintf("---- after round %d ----\n", iLoop);
      do{
        nProgress = 0;
        rMin = 0x7fff;
        for(ii=0, pTo=aTo; ii<nTo; ii++, pTo++){
          if( pTo->rCost>rFloor && pTo->rCost<rMin ) rMin = pTo->rCost;
        }
        for(ii=0, pTo=aTo; ii<nTo; ii++, pTo++){
          if( pTo->rCost==rMin ){
            sqlite3DebugPrintf(" %s cost=%-3d nrow=%-3d order=%c",
               wherePathName(pTo, iLoop+1, 0), pTo->rCost, pTo->nRow,
               pTo->isOrdered>=0 ? (pTo->isOrdered+'0') : '?');
            if( pTo->isOrdered>0 ){
              sqlite3DebugPrintf(" rev=0x%llx\n", pTo->revLoop);
            }else{
              sqlite3DebugPrintf("\n");
            }
            nDone++;
            nProgress++;
          }
        }
        rFloor = rMin;
      }while( nDone<nTo && nProgress>0 );
    }
#endif

    /* Swap the roles of aFrom and aTo for the next generation */
    pFrom = aTo;
    aTo = aFrom;
    aFrom = pFrom;
    nFrom = nTo;
  }

  if( nFrom==0 ){
    sqlite3ErrorMsg(pParse, "no query solution");
    sqlite3StackFreeNN(pParse->db, pSpace);
    return SQLITE_ERROR;
  }

  /* Find the lowest cost path.  pFrom will be left pointing to that path */
  pFrom = aFrom;
  for(ii=1; ii<nFrom; ii++){
    if( pFrom->rCost>aFrom[ii].rCost ) pFrom = &aFrom[ii];
  }
  assert( pWInfo->nLevel==nLoop );
  /* Load the lowest cost path into pWInfo */
  for(iLoop=0; iLoop<nLoop; iLoop++){
    WhereLevel *pLevel = pWInfo->a + iLoop;
    pLevel->pWLoop = pWLoop = pFrom->aLoop[iLoop];
    pLevel->iFrom = pWLoop->iTab;
    pLevel->iTabCur = pWInfo->pTabList->a[pLevel->iFrom].iCursor;
  }
  if( (pWInfo->wctrlFlags & WHERE_WANT_DISTINCT)!=0
   && (pWInfo->wctrlFlags & WHERE_DISTINCTBY)==0
   && pWInfo->eDistinct==WHERE_DISTINCT_NOOP
   && nRowEst
  ){
    Bitmask notUsed;
    int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pResultSet, pFrom,
                 WHERE_DISTINCTBY, nLoop-1, pFrom->aLoop[nLoop-1], &notUsed);
    if( rc==pWInfo->pResultSet->nExpr ){
      pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
    }
  }
  pWInfo->bOrderedInnerLoop = 0;
  if( pWInfo->pOrderBy ){
    pWInfo->nOBSat = pFrom->isOrdered;
    if( pWInfo->wctrlFlags & WHERE_DISTINCTBY ){
      if( pFrom->isOrdered==pWInfo->pOrderBy->nExpr ){
        pWInfo->eDistinct = WHERE_DISTINCT_ORDERED;
      }
      /* vvv--- See check-in [12ad822d9b827777] on 2023-03-16 ---vvv */
      assert( pWInfo->pSelect->pOrderBy==0
           || pWInfo->nOBSat <= pWInfo->pSelect->pOrderBy->nExpr );
    }else{
      pWInfo->revMask = pFrom->revLoop;
      if( pWInfo->nOBSat<=0 ){
        pWInfo->nOBSat = 0;
        if( nLoop>0 ){
          u32 wsFlags = pFrom->aLoop[nLoop-1]->wsFlags;
          if( (wsFlags & WHERE_ONEROW)==0
           && (wsFlags&(WHERE_IPK|WHERE_COLUMN_IN))!=(WHERE_IPK|WHERE_COLUMN_IN)
          ){
            Bitmask m = 0;
            int rc = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy, pFrom,
                      WHERE_ORDERBY_LIMIT, nLoop-1, pFrom->aLoop[nLoop-1], &m);
            testcase( wsFlags & WHERE_IPK );
            testcase( wsFlags & WHERE_COLUMN_IN );
            if( rc==pWInfo->pOrderBy->nExpr ){
              pWInfo->bOrderedInnerLoop = 1;
              pWInfo->revMask = m;
            }
          }
        }
      }else if( nLoop
            && pWInfo->nOBSat==1
            && (pWInfo->wctrlFlags & (WHERE_ORDERBY_MIN|WHERE_ORDERBY_MAX))!=0
            ){
        pWInfo->bOrderedInnerLoop = 1;
      }
    }
    if( (pWInfo->wctrlFlags & WHERE_SORTBYGROUP)
        && pWInfo->nOBSat==pWInfo->pOrderBy->nExpr && nLoop>0
    ){
      Bitmask revMask = 0;
      int nOrder = wherePathSatisfiesOrderBy(pWInfo, pWInfo->pOrderBy,
          pFrom, 0, nLoop-1, pFrom->aLoop[nLoop-1], &revMask
      );
      assert( pWInfo->sorted==0 );
      if( nOrder==pWInfo->pOrderBy->nExpr ){
        pWInfo->sorted = 1;
        pWInfo->revMask = revMask;
      }
    }
  }

  pWInfo->nRowOut = pFrom->nRow;
#ifdef WHERETRACE_ENABLED
  pWInfo->rTotalCost = pFrom->rCost;
#endif

  /* Free temporary memory and return success */
  sqlite3StackFreeNN(pParse->db, pSpace);
  return SQLITE_OK;
}